

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  uint32_t uVar1;
  uint uVar2;
  GMM_PLATFORM_INFO *pGVar3;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_70;
  uint32_t local_6c;
  uint local_60;
  uint local_5c;
  uint32_t BitsPerPixel;
  uint32_t MipWidth;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_GFX_SIZE_T MipOffset;
  uint32_t MipHeight;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t __MipLevel;
  uint32_t VAlign;
  uint32_t HAlign;
  uint uStack_24;
  uint8_t Compressed;
  uint32_t OffsetHeight;
  uint32_t i;
  uint32_t AlignedMipHeight;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  i = MipLevel;
  _AlignedMipHeight = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  pGVar3 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  __MipLevel = (_AlignedMipHeight->Alignment).HAlign;
  CompressHeight = (_AlignedMipHeight->Alignment).VAlign;
  VAlign._3_1_ = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,
                                 _AlignedMipHeight->Format);
  MipOffset._0_4_ = _AlignedMipHeight->BaseHeight;
  HAlign = 0;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,_AlignedMipHeight->Format,&MipHeight,&CompressDepth,
             (uint32_t *)((long)&MipOffset + 4));
  if (((((ulong)(_AlignedMipHeight->Flags).Info >> 0x25 & 1) == 0) &&
      (((ulong)(_AlignedMipHeight->Flags).Info >> 0x26 & 1) == 0)) &&
     (((ulong)(_AlignedMipHeight->Flags).Info >> 0x2c & 1) == 0)) {
    local_70 = i;
  }
  else {
    if (i < (_AlignedMipHeight->Alignment).MipTailStartLod) {
      local_6c = i;
    }
    else {
      local_6c = (_AlignedMipHeight->Alignment).MipTailStartLod;
    }
    local_70 = local_6c;
  }
  CompressWidth = local_70;
  if (local_70 < 2) {
    pPlatform = (GMM_PLATFORM_INFO *)0x0;
  }
  else {
    uVar1 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,_AlignedMipHeight,1);
    local_60 = _AlignedMipHeight->BitsPerPixel;
    if ((((ulong)(_AlignedMipHeight->Flags).Gpu >> 6 & 1) == 0) &&
       (((ulong)(_AlignedMipHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
      local_7c = 1;
    }
    else {
      local_7c = (_AlignedMipHeight->MSAA).NumSamples;
    }
    local_5c = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,uVar1,__MipLevel,local_7c);
    if (VAlign._3_1_ == '\0') {
      if (((((ulong)(_AlignedMipHeight->Flags).Gpu >> 0x1d & 1) == 0) ||
          (((ulong)(_AlignedMipHeight->Flags).Info >> 0x22 & 1) == 0)) &&
         ((((ulong)(_AlignedMipHeight->Flags).Gpu >> 1 & 1) != 0 &&
          (((ulong)(_AlignedMipHeight->Flags).Gpu >> 0x29 & 1) != 0)))) {
        local_60 = 8;
        uVar1 = _AlignedMipHeight->BitsPerPixel;
        if (uVar1 == 0x20) {
          local_5c = local_5c >> 3;
        }
        else if (uVar1 == 0x40) {
          local_5c = local_5c >> 2;
        }
        else if (uVar1 == 0x80) {
          local_5c = local_5c >> 1;
        }
      }
    }
    else {
      local_5c = local_5c / MipHeight;
    }
    pPlatform = (GMM_PLATFORM_INFO *)((ulong)local_5c * (ulong)local_60 >> 3);
  }
  for (uStack_24 = 1; uStack_24 <= CompressWidth; uStack_24 = uStack_24 + 1) {
    if ((((ulong)(_AlignedMipHeight->Flags).Gpu >> 6 & 1) == 0) &&
       (((ulong)(_AlignedMipHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
      local_8c = 1;
    }
    else {
      local_8c = (_AlignedMipHeight->MSAA).NumSamples;
    }
    OffsetHeight = GmmTextureCalc::ExpandHeight
                             (&this->super_GmmTextureCalc,(uint32_t)MipOffset,CompressHeight,
                              local_8c);
    if (VAlign._3_1_ == '\0') {
      if ((((ulong)(_AlignedMipHeight->Flags).Gpu >> 0x1d & 1) == 0) ||
         (((ulong)(_AlignedMipHeight->Flags).Info >> 0x22 & 1) == 0)) {
        if ((((ulong)(_AlignedMipHeight->Flags).Gpu >> 1 & 1) != 0) &&
           ((SUB84((_AlignedMipHeight->Flags).Gpu,4) >> 9 & 1) != 0)) {
          OffsetHeight = OffsetHeight >> 4;
        }
      }
      else {
        OffsetHeight = OffsetHeight >> 1;
      }
    }
    else {
      OffsetHeight = OffsetHeight / CompressDepth;
    }
    if (uStack_24 == 2) {
      local_90 = 0;
    }
    else {
      local_90 = OffsetHeight;
    }
    HAlign = local_90 + HAlign;
    MipOffset._0_4_ =
         (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])
                   (this,_AlignedMipHeight,(ulong)uStack_24);
  }
  if (pGVar3->TileInfo[_AlignedMipHeight->TileMode].LogicalTileDepth < 2) {
    local_94 = 1;
  }
  else {
    local_94 = pGVar3->TileInfo[_AlignedMipHeight->TileMode].LogicalTileDepth;
  }
  HAlign = local_94 * HAlign;
  pPlatform = (GMM_PLATFORM_INFO *)
              ((long)&(pPlatform->Platform).eProductFamily +
              (ulong)(HAlign * (int)_AlignedMipHeight->Pitch));
  if ((((((ulong)(_AlignedMipHeight->Flags).Info >> 0x25 & 1) != 0) ||
       (((ulong)(_AlignedMipHeight->Flags).Info >> 0x26 & 1) != 0)) ||
      (((ulong)(_AlignedMipHeight->Flags).Info >> 0x2c & 1) != 0)) &&
     ((_AlignedMipHeight->Alignment).MipTailStartLod <= i)) {
    uVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[9])(this,_AlignedMipHeight,(ulong)i)
    ;
    pPlatform = (GMM_PLATFORM_INFO *)((long)&(pPlatform->Platform).eProductFamily + (ulong)uVar2);
  }
  return (GMM_GFX_SIZE_T)pPlatform;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    uint32_t       AlignedMipHeight, i, OffsetHeight;
    uint8_t        Compressed;
    uint32_t       HAlign, VAlign, __MipLevel;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;
    uint32_t       MipHeight;
    GMM_GFX_SIZE_T MipOffset;

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    HAlign     = pTexInfo->Alignment.HAlign;
    VAlign     = pTexInfo->Alignment.VAlign;
    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipHeight    = pTexInfo->BaseHeight;
    OffsetHeight = 0;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    __MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;

    if(__MipLevel < 2) // LOD0 and LOD1 are on the left edge...
    {
        MipOffset = 0;
    }
    else // LOD2 and beyond are to the right of LOD1...
    {
        uint32_t MipWidth     = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, 1));
        uint32_t BitsPerPixel = pTexInfo->BitsPerPixel;

        MipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

        if(Compressed)
        {
            MipWidth /= CompressWidth;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
	    //Expt: Stencil Row interleaving, where Rowheight = VALign=8
            //XOffset on interleaved row not different than w/o interleave.
            //MipWidth *= 2;	
	}
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BitsPerPixel = 8; // Aux Surfaces are 8bpp

            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    MipWidth /= 8;
                    break;
                case 64:
                    MipWidth /= 4;
                    break;
                case 128:
                    MipWidth /= 2;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }

        MipOffset = (GMM_GFX_SIZE_T)MipWidth * BitsPerPixel >> 3;
    }

    for(i = 1; i <= __MipLevel; i++)
    {
        AlignedMipHeight = GFX_ULONG_CAST(__GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo));

        if(Compressed)
        {
            AlignedMipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            AlignedMipHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            AlignedMipHeight /= 16;
        }

        OffsetHeight += ((i != 2) ? AlignedMipHeight : 0);

        MipHeight = GmmTexGetMipHeight(pTexInfo, i);
    }
    OffsetHeight *= GFX_MAX(pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth, 1);

    MipOffset += OffsetHeight * GFX_ULONG_CAST(pTexInfo->Pitch);

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       (MipLevel >= pTexInfo->Alignment.MipTailStartLod))
    {
        MipOffset += GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    GMM_DPF_EXIT;
    return (MipOffset);
}